

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O0

void __thiscall TCLAP::CmdLine::~CmdLine(CmdLine *this)

{
  CmdLine *this_local;
  
  (this->super_CmdLineInterface)._vptr_CmdLineInterface = (_func_int **)&PTR__CmdLine_00141568;
  ClearContainer<std::__cxx11::list<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>>
            (&this->_argDeleteOnExitList);
  ClearContainer<std::__cxx11::list<TCLAP::Visitor*,std::allocator<TCLAP::Visitor*>>>
            (&this->_visitorDeleteOnExitList);
  if ((this->_userSetOutput & 1U) == 0) {
    if (this->_output != (CmdLineOutput *)0x0) {
      (*this->_output->_vptr_CmdLineOutput[1])();
    }
    this->_output = (CmdLineOutput *)0x0;
  }
  std::__cxx11::list<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_>::~list
            (&this->_visitorDeleteOnExitList);
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::~list
            (&this->_argDeleteOnExitList);
  XorHandler::~XorHandler(&this->_xorHandler);
  std::__cxx11::string::~string((string *)&this->_version);
  std::__cxx11::string::~string((string *)&this->_message);
  std::__cxx11::string::~string((string *)&this->_progName);
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::~list(&this->_argList);
  CmdLineInterface::~CmdLineInterface(&this->super_CmdLineInterface);
  return;
}

Assistant:

inline CmdLine::~CmdLine()
{
	ClearContainer(_argDeleteOnExitList);
	ClearContainer(_visitorDeleteOnExitList);

	if ( !_userSetOutput ) {
		delete _output;
		_output = 0;
	}
}